

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointPolicyPureVector.h
# Opt level: O0

void __thiscall
JointPolicyPureVector::JointPolicyPureVector(JointPolicyPureVector *this,JointPolicyPureVector *a)

{
  JointPolicyDiscretePure *in_RSI;
  JointPolicyDiscretePure *in_RDI;
  
  JointPolicyDiscretePure::JointPolicyDiscretePure(in_RDI,in_RSI);
  JPolComponent_VectorImplementation::JPolComponent_VectorImplementation
            ((JPolComponent_VectorImplementation *)(in_RDI + 0x38),
             (JPolComponent_VectorImplementation *)(in_RSI + 0x38));
  *(code **)in_RDI = ValueFunctionDecPOMDPDiscrete::CalculateV<false>;
  *(code **)(in_RDI + 0x38) = DecPOMDPDiscrete::CreateNewRewardModel;
  std::vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>::vector
            ((vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_> *)0x12bc98);
  return;
}

Assistant:

JointPolicyPureVector(const JointPolicyPureVector& a)
            :
            JointPolicyDiscretePure(a)
            , JPolComponent_VectorImplementation(a)
        {}